

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::disable_vertex_attrib_array
               (NegativeTestContext *ctx)

{
  NegativeTestContext *this;
  allocator<char> local_39;
  string local_38;
  GLuint local_14;
  NegativeTestContext *pNStack_10;
  int maxVertexAttribs;
  NegativeTestContext *ctx_local;
  
  pNStack_10 = ctx;
  local_14 = NegativeTestContext::getInteger(ctx,0x8869);
  this = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS."
             ,&local_39);
  NegativeTestContext::beginSection(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glDisableVertexAttribArray(&pNStack_10->super_CallLogWrapper,local_14);
  NegativeTestContext::expectError(pNStack_10,0x501);
  NegativeTestContext::endSection(pNStack_10);
  return;
}

Assistant:

void disable_vertex_attrib_array (NegativeTestContext& ctx)
{
	int maxVertexAttribs = ctx.getInteger(GL_MAX_VERTEX_ATTRIBS);

	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS.");
	ctx.glDisableVertexAttribArray(maxVertexAttribs);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}